

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

Bitset * __thiscall
spirv_cross::ParsedIR::get_buffer_block_flags
          (Bitset *__return_storage_ptr__,ParsedIR *this,SPIRVariable *var)

{
  bool bVar1;
  uint32_t id;
  SPIRType *type_00;
  CompilerError *this_00;
  Meta *pMVar2;
  undefined1 local_88 [8];
  Bitset all_members_flags;
  Meta *m;
  SPIRType *type;
  SPIRVariable *var_local;
  ParsedIR *this_local;
  Bitset *base_flags;
  
  id = TypedID::operator_cast_to_unsigned_int((TypedID *)&(var->super_IVariant).field_0xc);
  type_00 = get<spirv_cross::SPIRType>(this,id);
  if (type_00->basetype != Struct) {
    this_00 = (CompilerError *)__cxa_allocate_exception(0x10);
    CompilerError::CompilerError(this_00,"Cannot get buffer block flags for non-buffer variable.");
    __cxa_throw(this_00,&CompilerError::typeinfo,CompilerError::~CompilerError);
  }
  Bitset::Bitset(__return_storage_ptr__);
  all_members_flags.higher._M_h._M_single_bucket._4_4_ = (var->super_IVariant).self.id;
  pMVar2 = find_meta(this,all_members_flags.higher._M_h._M_single_bucket._4_4_);
  if (pMVar2 != (Meta *)0x0) {
    Bitset::operator=(__return_storage_ptr__,&(pMVar2->decoration).decoration_flags);
  }
  bVar1 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::empty
                    (&(type_00->member_types).
                      super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>);
  if (!bVar1) {
    get_buffer_block_type_flags((Bitset *)local_88,this,type_00);
    Bitset::merge_or(__return_storage_ptr__,(Bitset *)local_88);
    all_members_flags.higher._M_h._M_single_bucket._0_4_ = 1;
    Bitset::~Bitset((Bitset *)local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

Bitset ParsedIR::get_buffer_block_flags(const SPIRVariable &var) const
{
	auto &type = get<SPIRType>(var.basetype);
	if (type.basetype != SPIRType::Struct)
		SPIRV_CROSS_THROW("Cannot get buffer block flags for non-buffer variable.");

	// Some flags like non-writable, non-readable are actually found
	// as member decorations. If all members have a decoration set, propagate
	// the decoration up as a regular variable decoration.
	Bitset base_flags;
	auto *m = find_meta(var.self);
	if (m)
		base_flags = m->decoration.decoration_flags;

	if (type.member_types.empty())
		return base_flags;

	auto all_members_flags = get_buffer_block_type_flags(type);
	base_flags.merge_or(all_members_flags);
	return base_flags;
}